

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__modified
          (ColladaParserAutoGen14Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__modified()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__modified();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}